

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QLayout * __thiscall QWidget::takeLayout(QWidget *this)

{
  QWidgetPrivate *pQVar1;
  QLayout *l;
  QWidgetPrivate *d;
  QLayout *local_8;
  
  pQVar1 = d_func((QWidget *)0x37d91b);
  local_8 = layout((QWidget *)0x37d929);
  if (local_8 == (QLayout *)0x0) {
    local_8 = (QLayout *)0x0;
  }
  else {
    pQVar1->layout = (QLayout *)0x0;
    QObject::setParent(&local_8->super_QObject);
  }
  return local_8;
}

Assistant:

QLayout *QWidget::takeLayout()
{
    Q_D(QWidget);
    QLayout *l =  layout();
    if (!l)
        return nullptr;
    d->layout = nullptr;
    l->setParent(nullptr);
    return l;
}